

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O2

bool __thiscall
node::BlockManager::WriteBlockToDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  Level in_stack_ffffffffffffff98;
  TransactionSerParams *in_stack_ffffffffffffffa0;
  TransactionSerParams *fmt;
  CBlock *in_stack_ffffffffffffffa8;
  AutoFile fileout;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  OpenBlockFile(&fileout,this,pos,false);
  if (fileout.m_file == (FILE *)0x0) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "WriteBlockToDisk";
    logging_function._M_len = 0x10;
    LogPrintf_<char[17]>
              (logging_function,source_file,0x3cf,
               IPC|I2P|QT|LIBEVENT|PRUNE|CMPCTBLOCK|SELECTCOINS|ADDRMAN|ESTIMATEFEE|RPC|ZMQ,
               in_stack_ffffffffffffff98,&in_stack_ffffffffffffffa0->allow_witness,
               (char (*) [17])in_stack_ffffffffffffffa8);
  }
  else {
    fmt = &::TX_WITH_WITNESS;
    sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CBlock_const>>
                      ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&stack0xffffffffffffffa0
                      );
    Serialize<AutoFile,_unsigned_char,_4UL>(&fileout,&((this->m_opts).chainparams)->pchMessageStart)
    ;
    ser_writedata32<AutoFile>(&fileout,(uint32_t)sVar2);
    lVar3 = ftell((FILE *)fileout.m_file);
    if (-1 < lVar3) {
      pos->nPos = (uint)lVar3;
      ParamsWrapper<TransactionSerParams,_const_CBlock>::Serialize<AutoFile>
                ((ParamsWrapper<TransactionSerParams,_const_CBlock> *)&stack0xffffffffffffffa0,
                 &fileout);
      bVar4 = true;
      goto LAB_007638f6;
    }
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file_00._M_len = 0x5e;
    logging_function_00._M_str = "WriteBlockToDisk";
    logging_function_00._M_len = 0x10;
    LogPrintf_<char[17]>
              (logging_function_00,source_file_00,0x3da,
               IPC|I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|CMPCTBLOCK|ADDRMAN|ZMQ|BENCH|HTTP|TOR|NET,
               in_stack_ffffffffffffff98,&fmt->allow_witness,(char (*) [17])block);
  }
  bVar4 = false;
LAB_007638f6:
  AutoFile::~AutoFile(&fileout);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::WriteBlockToDisk(const CBlock& block, FlatFilePos& pos) const
{
    // Open history file to append
    AutoFile fileout{OpenBlockFile(pos)};
    if (fileout.IsNull()) {
        LogError("%s: OpenBlockFile failed\n", __func__);
        return false;
    }

    // Write index header
    unsigned int nSize = GetSerializeSize(TX_WITH_WITNESS(block));
    fileout << GetParams().MessageStart() << nSize;

    // Write block
    long fileOutPos = ftell(fileout.Get());
    if (fileOutPos < 0) {
        LogError("%s: ftell failed\n", __func__);
        return false;
    }
    pos.nPos = (unsigned int)fileOutPos;
    fileout << TX_WITH_WITNESS(block);

    return true;
}